

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::mktree(Path *this)

{
  bool bVar1;
  __mode_t extraout_EDX;
  __mode_t extraout_EDX_00;
  __mode_t __mode;
  Path *__path;
  Path p;
  Path local_30;
  
  if (((this->m_path)._M_string_length != 1) || (*(this->m_path)._M_dataplus._M_p != '/')) {
    bVar1 = is_directory(this);
    if (!bVar1) {
      __path = this;
      dirname(&local_30,(char *)this);
      bVar1 = is_directory(&local_30);
      __mode = extraout_EDX;
      if (!bVar1) {
        mktree(&local_30);
        __mode = extraout_EDX_00;
      }
      mkdir(this,(char *)__path,__mode);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30.m_path._M_dataplus._M_p != &local_30.m_path.field_2) {
        operator_delete(local_30.m_path._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void Path::mktree() const
{
  // Root is required to exist
  if (is_root())
    return;

  if (!is_directory()) {
    Path p = parent();

    if (!p.is_directory()) {
      p.mktree();
    }

    mkdir();
  }

}